

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_mus.cpp
# Opt level: O2

bool midi_processor::process_mus
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  const_iterator cVar1;
  byte bVar2;
  byte bVar3;
  pointer puVar4;
  int iVar5;
  ulong uVar6;
  event_type p_type;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  const_iterator end;
  size_t sStack_c0;
  byte local_b3;
  byte local_b2;
  const_iterator it;
  midi_track track;
  midi_event local_88;
  uint8_t velocity_levels [16];
  
  puVar4 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = (ulong)*(ushort *)(puVar4 + 4);
  uVar10 = (ulong)*(ushort *)(puVar4 + 6);
  midi_container::initialize(p_out,0,0x59);
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  midi_event::midi_event(&local_88,0,extended,0,mus_default_tempo,5);
  midi_track::add_event(&track,&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_88.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  midi_event::midi_event(&local_88,0,extended,0,end_of_track,2);
  midi_track::add_event(&track,&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_88.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
  midi_container::add_track(p_out,&track);
  std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&track.m_events);
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  velocity_levels[0] = '\0';
  velocity_levels[1] = '\0';
  velocity_levels[2] = '\0';
  velocity_levels[3] = '\0';
  velocity_levels[4] = '\0';
  velocity_levels[5] = '\0';
  velocity_levels[6] = '\0';
  velocity_levels[7] = '\0';
  velocity_levels[8] = '\0';
  velocity_levels[9] = '\0';
  velocity_levels[10] = '\0';
  velocity_levels[0xb] = '\0';
  velocity_levels[0xc] = '\0';
  velocity_levels[0xd] = '\0';
  velocity_levels[0xe] = '\0';
  velocity_levels[0xf] = '\0';
  puVar4 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (long)(p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar4;
  bVar7 = false;
  if ((uVar10 < uVar6) && (bVar7 = false, uVar10 + uVar11 <= uVar6)) {
    it._M_current = puVar4 + uVar10;
    end._M_current = it._M_current + uVar11;
    uVar9 = 0;
    do {
      do {
        cVar1._M_current = it._M_current;
        if (it._M_current == end._M_current) {
LAB_0010e10c:
          it._M_current = cVar1._M_current;
          midi_event::midi_event(&local_88,(ulong)uVar9,extended,0,end_of_track,2);
          midi_track::add_event(&track,&local_88);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_88.m_ext_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          bVar7 = true;
          midi_container::add_track(p_out,&track);
          goto LAB_0010e156;
        }
        cVar1._M_current = it._M_current + 1;
        bVar2 = *it._M_current;
        if (bVar2 == 0x60) goto LAB_0010e10c;
        uVar8 = bVar2 & 0xf;
        uVar6 = (ulong)((uVar8 + 1) - (uint)((byte)uVar8 < 9));
        if (uVar8 == 0xf) {
          uVar6 = 9;
        }
        switch(bVar2 >> 4 & 7) {
        case 0:
          if (cVar1._M_current != end._M_current) {
            local_b3 = it._M_current[1];
            local_b2 = 0;
            it._M_current = it._M_current + 2;
            goto LAB_0010e0b9;
          }
          goto switchD_0010df73_default;
        case 1:
          if (cVar1._M_current == end._M_current) goto switchD_0010df73_default;
          cVar1._M_current = it._M_current + 2;
          local_b3 = it._M_current[1];
          if ((char)local_b3 < '\0') {
            if (cVar1._M_current == end._M_current) goto switchD_0010df73_default;
            local_b2 = it._M_current[2];
            velocity_levels[uVar6] = local_b2;
            local_b3 = local_b3 & 0x7f;
            it._M_current = it._M_current + 3;
          }
          else {
            local_b2 = velocity_levels[uVar6];
            it._M_current = cVar1._M_current;
          }
LAB_0010e0b9:
          p_type = note_on;
          break;
        case 2:
          if (cVar1._M_current == end._M_current) goto switchD_0010df73_default;
          local_b2 = it._M_current[1] >> 1;
          local_b3 = it._M_current[1] << 7;
          p_type = pitch_wheel;
          it._M_current = it._M_current + 2;
          break;
        case 3:
          if (cVar1._M_current == end._M_current) goto switchD_0010df73_default;
          cVar1._M_current = it._M_current + 2;
          if (4 < (byte)(it._M_current[1] - 10)) goto switchD_0010df73_default;
          local_b3 = ""[it._M_current[1]];
          local_b2 = 1;
          it._M_current = it._M_current + 2;
LAB_0010e04c:
          p_type = control_change;
          break;
        case 4:
          if (cVar1._M_current != end._M_current) {
            cVar1._M_current = it._M_current + 2;
            bVar3 = it._M_current[1];
            if ((ulong)bVar3 == 0) {
              if (cVar1._M_current != end._M_current) {
                local_b3 = it._M_current[2];
                p_type = program_change;
                sStack_c0 = 1;
                it._M_current = it._M_current + 3;
                goto LAB_0010e0be;
              }
            }
            else if ((bVar3 < 10) && (local_b3 = ""[bVar3], cVar1._M_current != end._M_current)) {
              local_b2 = it._M_current[2];
              it._M_current = it._M_current + 3;
              goto LAB_0010e04c;
            }
          }
        default:
          goto switchD_0010df73_default;
        }
        sStack_c0 = 2;
LAB_0010e0be:
        midi_event::midi_event(&local_88,(ulong)uVar9,p_type,(uint)uVar6,&local_b3,sStack_c0);
        midi_track::add_event(&track,&local_88);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&local_88.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      } while (-1 < (char)bVar2);
      iVar5 = decode_delta(&it,end);
      uVar9 = uVar9 + iVar5;
      cVar1 = it;
    } while (-1 < iVar5);
switchD_0010df73_default:
    it._M_current = cVar1._M_current;
    bVar7 = false;
  }
LAB_0010e156:
  std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&track.m_events);
  return bVar7;
}

Assistant:

bool midi_processor::process_mus( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    uint16_t length = p_file[ 4 ] | ( p_file[ 5 ] << 8 );
    uint16_t offset = p_file[ 6 ] | ( p_file[ 7 ] << 8 );

    p_out.initialize( 0, 0x59 );

    {
        midi_track track;
        track.add_event( midi_event( 0, midi_event::extended, 0, mus_default_tempo, _countof( mus_default_tempo ) ) );
        track.add_event( midi_event( 0, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );
        p_out.add_track( track );
    }

    midi_track track;

    unsigned current_timestamp = 0;

    uint8_t velocity_levels[ 16 ] = { 0 };

    if ( (size_t)offset >= p_file.size() || (size_t)(offset + length) > p_file.size() )
        return false;

    std::vector<uint8_t>::const_iterator it = p_file.begin() + offset, end = p_file.begin() + offset + length;

    uint8_t buffer[ 4 ];

    while ( it != end )
    {
        buffer[ 0 ] = *it++;
        if ( buffer[ 0 ] == 0x60 ) break;

        midi_event::event_type type;

        unsigned bytes_to_write;

        unsigned channel = buffer[ 0 ] & 0x0F;
        if ( channel == 0x0F ) channel = 9;
        else if ( channel >= 9 ) ++channel;

        switch ( buffer[ 0 ] & 0x70 )
        {
        case 0x00:
            type = midi_event::note_on;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            buffer[ 2 ] = 0;
            bytes_to_write = 2;
            break;

        case 0x10:
            type = midi_event::note_on;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] & 0x80 )
            {
                if ( it == end ) return false;
                buffer[ 2 ] = *it++;
                velocity_levels[ channel ] = buffer[ 2 ];
                buffer[ 1 ] &= 0x7F;
            }
            else
            {
                buffer[ 2 ] = velocity_levels[ channel ];
            }
            bytes_to_write = 2;
            break;

        case 0x20:
            type = midi_event::pitch_wheel;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            buffer[ 2 ] = buffer[ 1 ] >> 1;
            buffer[ 1 ] <<= 7;
            bytes_to_write = 2;
            break;

        case 0x30:
            type = midi_event::control_change;
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] >= 10 && buffer[ 1 ] <= 14 )
            {
                buffer[ 1 ] = mus_controllers[ buffer[ 1 ] ];
                buffer[ 2 ] = 1;
                bytes_to_write = 2;
            }
            else return false; /*throw exception_io_data( "Unhandled MUS system event" );*/
            break;

        case 0x40:
            if ( it == end ) return false;
            buffer[ 1 ] = *it++;
            if ( buffer[ 1 ] )
            {
                if ( buffer[ 1 ] < 10 )
                {
                    type = midi_event::control_change;
                    buffer[ 1 ] = mus_controllers[ buffer[ 1 ] ];
                    if ( it == end ) return false;
                    buffer[ 2 ] = *it++;
                    bytes_to_write = 2;
                }
                else return false; /*throw exception_io_data( "Invalid MUS controller change event" );*/
            }
            else
            {
                type = midi_event::program_change;
                if ( it == end ) return false;
                buffer[ 1 ] = *it++;
                bytes_to_write = 1;
            }
            break;

        default:
            return false; /*throw exception_io_data( "Invalid MUS status code" );*/
        }

        track.add_event( midi_event( current_timestamp, type, channel, buffer + 1, bytes_to_write ) );

        if ( buffer[ 0 ] & 0x80 )
        {
            int delta = decode_delta( it, end );
            if ( delta < 0 ) return false; /*throw exception_io_data( "Invalid MUS delta" );*/
            current_timestamp += delta;
        }
    }

    track.add_event( midi_event( current_timestamp, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );

    p_out.add_track( track );

    return true;
}